

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLMG.cpp
# Opt level: O0

void __thiscall amrex::MLMG::computeResWithCrseCorFineCor(MLMG *this,int falev)

{
  int i;
  Any *pAVar1;
  Any *pAVar2;
  Any *pAVar3;
  Any *pAVar4;
  undefined4 in_ESI;
  long in_RDI;
  Any *fine_rescor;
  Any *fine_res;
  Any *fine_cor;
  Any *crse_cor;
  IntVect nghost;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  Vector<amrex::Any,_std::allocator<amrex::Any>_> *in_stack_ffffffffffffffa0;
  IntVect local_24;
  IntVect local_18;
  undefined4 local_c;
  
  local_c = in_ESI;
  IntVect::IntVect(&local_18,0);
  if (*(int *)(in_RDI + 0x24) == 1) {
    i = (**(code **)(**(long **)(in_RDI + 0x48) + 0x30))(*(long **)(in_RDI + 0x48),local_c,0);
    IntVect::IntVect(&local_24,i);
    local_18.vect[0] = local_24.vect[0];
    local_18.vect[1] = local_24.vect[1];
    local_18.vect[2] = local_24.vect[2];
  }
  Vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
  ::operator[]((Vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                *)in_stack_ffffffffffffffa0,
               CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  pAVar1 = Vector<amrex::Any,_std::allocator<amrex::Any>_>::operator[]
                     (in_stack_ffffffffffffffa0,
                      CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  Vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
  ::operator[]((Vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                *)in_stack_ffffffffffffffa0,
               CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  pAVar2 = Vector<amrex::Any,_std::allocator<amrex::Any>_>::operator[]
                     (in_stack_ffffffffffffffa0,
                      CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  Vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
  ::operator[]((Vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                *)in_stack_ffffffffffffffa0,
               CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  pAVar3 = Vector<amrex::Any,_std::allocator<amrex::Any>_>::operator[]
                     (in_stack_ffffffffffffffa0,
                      CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  Vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
  ::operator[]((Vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                *)in_stack_ffffffffffffffa0,
               CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  pAVar4 = Vector<amrex::Any,_std::allocator<amrex::Any>_>::operator[]
                     (in_stack_ffffffffffffffa0,
                      CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  (**(code **)(**(long **)(in_RDI + 0x48) + 0x1a8))
            (*(long **)(in_RDI + 0x48),local_c,0,pAVar4,pAVar2,pAVar3,1,pAVar1);
  (**(code **)(**(long **)(in_RDI + 0x48) + 0x160))
            (*(long **)(in_RDI + 0x48),pAVar3,pAVar4,&local_18);
  return;
}

Assistant:

void
MLMG::computeResWithCrseCorFineCor (int falev)
{
    BL_PROFILE("MLMG::computeResWithCrseCorFineCor()");

    IntVect nghost(0);
    if (cf_strategy == CFStrategy::ghostnodes) nghost = IntVect(linop.getNGrow(falev));

    const Any& crse_cor = cor[falev-1][0];

    Any& fine_cor    = cor   [falev][0];
    Any& fine_res    = res   [falev][0];
    Any& fine_rescor = rescor[falev][0];

    // fine_rescor = fine_res - L(fine_cor)
    linop.AnyCorrectionResidual(falev, 0, fine_rescor, fine_cor, fine_res,
                                BCMode::Inhomogeneous, &crse_cor);
    linop.AnyCopy(fine_res, fine_rescor, nghost);
}